

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O2

UniquePtr<SSL_SESSION> __thiscall
bssl::SSL_SESSION_dup(bssl *this,SSL_SESSION *session,int dup_flags)

{
  byte bVar1;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> in_01;
  Span<const_unsigned_char> in_02;
  Span<const_unsigned_char> in_03;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Head_base<0UL,_ssl_session_st_*,_false> _Var5;
  _Head_base<0UL,_crypto_buffer_st_*,_false> _Var6;
  byte bVar7;
  bool bVar8;
  char *pcVar9;
  stack_st_CRYPTO_BUFFER *psVar10;
  UniquePtr<SSL_SESSION> new_session;
  SSL_X509_METHOD *in_stack_ffffffffffffffc8;
  _Head_base<0UL,_ssl_session_st_*,_false> local_30;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_28;
  
  ssl_session_new(in_stack_ffffffffffffffc8);
  if (local_30._M_head_impl != (SSL_SESSION *)0x0) {
    bVar7 = session->field_0x1b8 & 0x10;
    bVar1 = (local_30._M_head_impl)->field_0x1b8;
    (local_30._M_head_impl)->field_0x1b8 = bVar1 & 0xef | bVar7;
    (local_30._M_head_impl)->ssl_version = session->ssl_version;
    (local_30._M_head_impl)->field_0x1b8 = bVar1 & 0xcf | bVar7 | session->field_0x1b8 & 0x20;
    InplaceVector<unsigned_char,_32UL>::operator=
              (&(local_30._M_head_impl)->sid_ctx,&session->sid_ctx);
    InplaceVector<unsigned_char,_64UL>::operator=(&(local_30._M_head_impl)->secret,&session->secret)
    ;
    _Var5._M_head_impl = local_30._M_head_impl;
    (local_30._M_head_impl)->cipher = session->cipher;
    pcVar9 = (session->psk_identity)._M_t.super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
    if (pcVar9 != (char *)0x0) {
      pcVar9 = OPENSSL_strdup(pcVar9);
      std::__uniq_ptr_impl<char,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<char,_bssl::internal::Deleter> *)
                 &(_Var5._M_head_impl)->psk_identity,pcVar9);
      if (((local_30._M_head_impl)->psk_identity)._M_t.
          super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl == (char *)0x0) goto LAB_00158b06;
    }
    _Var5._M_head_impl = local_30._M_head_impl;
    psVar10 = (session->certs)._M_t.
              super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl;
    if (psVar10 != (stack_st_CRYPTO_BUFFER *)0x0) {
      psVar10 = sk_CRYPTO_BUFFER_deep_copy
                          (psVar10,SSL_SESSION_dup::anon_class_1_0_00000001::__invoke,
                           CRYPTO_BUFFER_free);
      std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                 &(_Var5._M_head_impl)->certs,psVar10);
      if (((local_30._M_head_impl)->certs)._M_t.
          super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl ==
          (stack_st_CRYPTO_BUFFER *)0x0) goto LAB_00158b06;
    }
    bVar8 = (*session->x509_method->session_dup)(local_30._M_head_impl,session);
    if (bVar8) {
      (local_30._M_head_impl)->verify_result = session->verify_result;
      UpRef((bssl *)&local_28,&session->ocsp_response);
      _Var6._M_head_impl = local_28._M_head_impl;
      local_28._M_head_impl = (pointer)0x0;
      std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)
                 &(local_30._M_head_impl)->ocsp_response,_Var6._M_head_impl);
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_28);
      UpRef((bssl *)&local_28,&session->signed_cert_timestamp_list);
      _Var6._M_head_impl = local_28._M_head_impl;
      local_28._M_head_impl = (pointer)0x0;
      std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)
                 &(local_30._M_head_impl)->signed_cert_timestamp_list,_Var6._M_head_impl);
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_28);
      uVar2 = *(undefined8 *)session->peer_sha256;
      uVar3 = *(undefined8 *)(session->peer_sha256 + 8);
      uVar4 = *(undefined8 *)(session->peer_sha256 + 0x18);
      *(undefined8 *)((local_30._M_head_impl)->peer_sha256 + 0x10) =
           *(undefined8 *)(session->peer_sha256 + 0x10);
      *(undefined8 *)((local_30._M_head_impl)->peer_sha256 + 0x18) = uVar4;
      *(undefined8 *)(local_30._M_head_impl)->peer_sha256 = uVar2;
      *(undefined8 *)((local_30._M_head_impl)->peer_sha256 + 8) = uVar3;
      (local_30._M_head_impl)->field_0x1b8 =
           (local_30._M_head_impl)->field_0x1b8 & 0xfd | session->field_0x1b8 & 2;
      (local_30._M_head_impl)->peer_signature_algorithm = session->peer_signature_algorithm;
      *(undefined8 *)&(local_30._M_head_impl)->timeout = *(undefined8 *)&session->timeout;
      (local_30._M_head_impl)->time = session->time;
      if ((dup_flags & 2U) != 0) {
        InplaceVector<unsigned_char,_32UL>::operator=
                  (&(local_30._M_head_impl)->session_id,&session->session_id);
        (local_30._M_head_impl)->group_id = session->group_id;
        InplaceVector<unsigned_char,_64UL>::operator=
                  (&(local_30._M_head_impl)->original_handshake_hash,
                   &session->original_handshake_hash);
        *(undefined8 *)&(local_30._M_head_impl)->ticket_lifetime_hint =
             *(undefined8 *)&session->ticket_lifetime_hint;
        (local_30._M_head_impl)->ticket_max_early_data = session->ticket_max_early_data;
        bVar7 = session->field_0x1b8 & 1;
        bVar1 = (local_30._M_head_impl)->field_0x1b8;
        (local_30._M_head_impl)->field_0x1b8 = bVar1 & 0xfe | bVar7;
        (local_30._M_head_impl)->field_0x1b8 = bVar1 & 0xbe | bVar7 | session->field_0x1b8 & 0x40;
        in_00.data_ = (session->early_alpn).data_;
        in_00.size_ = (session->early_alpn).size_;
        bVar8 = Array<unsigned_char>::CopyFrom(&(local_30._M_head_impl)->early_alpn,in_00);
        if ((((!bVar8) ||
             (in_01.data_ = (session->quic_early_data_context).data_,
             in_01.size_ = (session->quic_early_data_context).size_,
             bVar8 = Array<unsigned_char>::CopyFrom
                               (&(local_30._M_head_impl)->quic_early_data_context,in_01), !bVar8))
            || (in_02.data_ = (session->local_application_settings).data_,
               in_02.size_ = (session->local_application_settings).size_,
               bVar8 = Array<unsigned_char>::CopyFrom
                                 (&(local_30._M_head_impl)->local_application_settings,in_02),
               !bVar8)) ||
           (in_03.data_ = (session->peer_application_settings).data_,
           in_03.size_ = (session->peer_application_settings).size_,
           bVar8 = Array<unsigned_char>::CopyFrom
                             (&(local_30._M_head_impl)->peer_application_settings,in_03), !bVar8))
        goto LAB_00158b06;
      }
      if (((dup_flags & 1U) == 0) ||
         (in.data_ = (session->ticket).data_, in.size_ = (session->ticket).size_,
         bVar8 = Array<unsigned_char>::CopyFrom(&(local_30._M_head_impl)->ticket,in), bVar8)) {
        (local_30._M_head_impl)->field_0x1b8 = (local_30._M_head_impl)->field_0x1b8 | 4;
        *(ssl_session_st **)this = local_30._M_head_impl;
        local_30._M_head_impl = (SSL_SESSION *)0x0;
        goto LAB_00158b0a;
      }
    }
  }
LAB_00158b06:
  *(undefined8 *)this = 0;
LAB_00158b0a:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_30);
  return (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

UniquePtr<SSL_SESSION> SSL_SESSION_dup(SSL_SESSION *session, int dup_flags) {
  UniquePtr<SSL_SESSION> new_session = ssl_session_new(session->x509_method);
  if (!new_session) {
    return nullptr;
  }

  new_session->is_server = session->is_server;
  new_session->ssl_version = session->ssl_version;
  new_session->is_quic = session->is_quic;
  new_session->sid_ctx = session->sid_ctx;

  // Copy the key material.
  new_session->secret = session->secret;
  new_session->cipher = session->cipher;

  // Copy authentication state.
  if (session->psk_identity != nullptr) {
    new_session->psk_identity.reset(
        OPENSSL_strdup(session->psk_identity.get()));
    if (new_session->psk_identity == nullptr) {
      return nullptr;
    }
  }
  if (session->certs != nullptr) {
    auto buf_up_ref = [](const CRYPTO_BUFFER *buf) {
      CRYPTO_BUFFER_up_ref(const_cast<CRYPTO_BUFFER *>(buf));
      return const_cast<CRYPTO_BUFFER *>(buf);
    };
    new_session->certs.reset(sk_CRYPTO_BUFFER_deep_copy(
        session->certs.get(), buf_up_ref, CRYPTO_BUFFER_free));
    if (new_session->certs == nullptr) {
      return nullptr;
    }
  }

  if (!session->x509_method->session_dup(new_session.get(), session)) {
    return nullptr;
  }

  new_session->verify_result = session->verify_result;

  new_session->ocsp_response = UpRef(session->ocsp_response);
  new_session->signed_cert_timestamp_list =
      UpRef(session->signed_cert_timestamp_list);

  OPENSSL_memcpy(new_session->peer_sha256, session->peer_sha256,
                 SHA256_DIGEST_LENGTH);
  new_session->peer_sha256_valid = session->peer_sha256_valid;

  new_session->peer_signature_algorithm = session->peer_signature_algorithm;

  new_session->timeout = session->timeout;
  new_session->auth_timeout = session->auth_timeout;
  new_session->time = session->time;

  // Copy non-authentication connection properties.
  if (dup_flags & SSL_SESSION_INCLUDE_NONAUTH) {
    new_session->session_id = session->session_id;
    new_session->group_id = session->group_id;
    new_session->original_handshake_hash = session->original_handshake_hash;
    new_session->ticket_lifetime_hint = session->ticket_lifetime_hint;
    new_session->ticket_age_add = session->ticket_age_add;
    new_session->ticket_max_early_data = session->ticket_max_early_data;
    new_session->extended_master_secret = session->extended_master_secret;
    new_session->has_application_settings = session->has_application_settings;

    if (!new_session->early_alpn.CopyFrom(session->early_alpn) ||
        !new_session->quic_early_data_context.CopyFrom(
            session->quic_early_data_context) ||
        !new_session->local_application_settings.CopyFrom(
            session->local_application_settings) ||
        !new_session->peer_application_settings.CopyFrom(
            session->peer_application_settings)) {
      return nullptr;
    }
  }

  // Copy the ticket.
  if (dup_flags & SSL_SESSION_INCLUDE_TICKET &&
      !new_session->ticket.CopyFrom(session->ticket)) {
    return nullptr;
  }

  // The new_session does not get a copy of the ex_data.

  new_session->not_resumable = true;
  return new_session;
}